

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void process_file(path *file,vector<IncludePath,_std::allocator<IncludePath>_> *include_paths,
                 map<IncludePath,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::less<IncludePath>,_std::allocator<std::pair<const_IncludePath,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>_>_>
                 *headers,ProcessResult *result)

{
  long lVar1;
  pointer pcVar2;
  pointer pCVar3;
  int iVar4;
  ostream *poVar5;
  istream *piVar6;
  size_t *psVar7;
  basic_ostream<char,_std::char_traits<char>_> *pbVar8;
  ulong uVar9;
  long *plVar10;
  long *plVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  IncludeStmt current;
  string fixed_path_with_quotes;
  string path_with_quotes;
  string line;
  string path;
  string behind_path;
  string prefix_system;
  vector<Candidate,_std::allocator<Candidate>_> candidate_fixes;
  string prefix_user;
  string prefix_all;
  Candidate fix;
  stringstream buffer;
  ifstream in;
  IncludeStmt local_768;
  char *local_740;
  long local_738;
  char local_730;
  undefined7 uStack_72f;
  char *local_720;
  long local_718;
  char local_710;
  undefined7 uStack_70f;
  char *local_700;
  long local_6f8;
  char local_6f0;
  undefined7 uStack_6ef;
  path *local_6e0;
  long *local_6d8;
  long local_6d0;
  long local_6c8;
  long lStack_6c0;
  undefined1 *local_6b8;
  size_t local_6b0;
  undefined1 local_6a8;
  undefined7 uStack_6a7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  char *local_678;
  long local_670;
  char local_668;
  undefined7 uStack_667;
  long *local_658;
  ulong local_650;
  long local_648 [2];
  vector<Candidate,_std::allocator<Candidate>_> local_638;
  long *local_620;
  ulong local_618;
  long local_610 [2];
  long *local_600 [2];
  long local_5f0 [2];
  size_t *local_5e0;
  size_t *local_5d8;
  vector<IncludePath,_std::allocator<IncludePath>_> *local_5d0;
  map<IncludePath,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::less<IncludePath>,_std::allocator<std::pair<const_IncludePath,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>_>_>
  *local_5c8;
  undefined1 local_5c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b0;
  char local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  undefined8 local_570;
  ios_base local_4c8 [264];
  stringstream local_3c0 [16];
  ostream local_3b0 [112];
  ios_base local_340 [264];
  long *local_238;
  long local_230;
  long local_228 [63];
  
  local_5d0 = include_paths;
  local_5c8 = headers;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    Process ",0xc);
  pcVar2 = (file->_M_pathname)._M_dataplus._M_p;
  local_6e0 = file;
  local_238 = local_228;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,pcVar2,pcVar2 + (file->_M_pathname)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_238,local_230);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ...",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_238 != local_228) {
    operator_delete(local_238,local_228[0] + 1);
  }
  std::__cxx11::stringstream::stringstream(local_3c0);
  pcVar2 = (local_6e0->_M_pathname)._M_dataplus._M_p;
  local_5c0._0_8_ = &local_5b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5c0,pcVar2,pcVar2 + (local_6e0->_M_pathname)._M_string_length);
  std::ifstream::ifstream(&local_238,(string *)local_5c0,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._0_8_ != &local_5b0) {
    operator_delete((void *)local_5c0._0_8_,local_5b0._M_allocated_capacity + 1);
  }
  local_700 = &local_6f0;
  local_6f8 = 0;
  local_6f0 = '\0';
  local_5d8 = &result->system_to_user;
  local_5e0 = &result->user_to_system;
  do {
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&local_238,(string *)&local_700,'\n');
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
      std::ifstream::close();
      if (dry_run == false) {
        pcVar2 = (local_6e0->_M_pathname)._M_dataplus._M_p;
        local_768.path._M_dataplus._M_p = (pointer)&local_768.path.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_768,pcVar2,pcVar2 + (local_6e0->_M_pathname)._M_string_length);
        std::ofstream::ofstream(local_5c0,(string *)&local_768,_S_out);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_768.path._M_dataplus._M_p != &local_768.path.field_2) {
          operator_delete(local_768.path._M_dataplus._M_p,
                          local_768.path.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_5c0,local_768.path._M_dataplus._M_p,
                   local_768.path._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_768.path._M_dataplus._M_p != &local_768.path.field_2) {
          operator_delete(local_768.path._M_dataplus._M_p,
                          local_768.path.field_2._M_allocated_capacity + 1);
        }
        std::ofstream::close();
        local_5c0._0_8_ = _VTT;
        *(undefined8 *)(local_5c0 + *(long *)(_VTT->_M_local_buf + -0x18)) = __M_split_cmpts;
        std::filebuf::~filebuf((filebuf *)(local_5c0 + 8));
        std::ios_base::~ios_base(local_4c8);
      }
      if (local_700 != &local_6f0) {
        operator_delete(local_700,CONCAT71(uStack_6ef,local_6f0) + 1);
      }
      std::ifstream::~ifstream(&local_238);
      std::__cxx11::stringstream::~stringstream(local_3c0);
      std::ios_base::~ios_base(local_340);
      return;
    }
    local_600[0] = local_5f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_600,"#include ","");
    local_658 = local_648;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"#include <","");
    local_620 = local_610;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_620,"#include \"","");
    plVar11 = local_620;
    if (local_618 != 0 && local_6f8 != 0) {
      lVar13 = 0;
      do {
        if (local_700[lVar13] != *(char *)((long)local_620 + lVar13)) goto LAB_00109909;
        lVar1 = lVar13 + 1;
      } while ((local_6f8 + -1 != lVar13) &&
              (bVar14 = local_618 - 1 != lVar13, lVar13 = lVar1, bVar14));
      plVar11 = (long *)(lVar1 + (long)local_620);
    }
    if (plVar11 == (long *)((long)local_620 + local_618)) {
LAB_00109977:
      result->total = result->total + 1;
      local_6b8 = &local_6a8;
      local_6b0 = 0;
      local_6a8 = 0;
      local_678 = &local_668;
      local_670 = 0;
      local_668 = '\0';
      local_720 = &local_710;
      local_718 = 0;
      local_710 = '\0';
      plVar11 = local_620;
      if (local_618 != 0 && local_6f8 != 0) {
        lVar13 = 0;
        do {
          if (local_700[lVar13] != *(char *)((long)local_620 + lVar13)) goto LAB_00109a0d;
          lVar1 = lVar13 + 1;
        } while ((local_6f8 + -1 != lVar13) &&
                (bVar14 = local_618 - 1 != lVar13, lVar13 = lVar1, bVar14));
        plVar11 = (long *)((long)local_620 + lVar1);
      }
      if (plVar11 == (long *)((long)local_620 + local_618)) {
        std::__cxx11::string::find((char *)&local_700,0x11399f,local_618);
        bVar14 = false;
      }
      else {
LAB_00109a0d:
        plVar11 = local_658;
        if (local_650 != 0 && local_6f8 != 0) {
          lVar13 = 0;
          do {
            if (local_700[lVar13] != *(char *)((long)local_658 + lVar13)) goto LAB_00109a6a;
            lVar1 = lVar13 + 1;
          } while ((local_6f8 + -1 != lVar13) &&
                  (bVar14 = local_650 - 1 != lVar13, lVar13 = lVar1, bVar14));
          plVar11 = (long *)(lVar1 + (long)local_658);
        }
        if (plVar11 == (long *)((long)local_658 + local_650)) {
          std::__cxx11::string::find((char *)&local_700,0x1139a1,local_650);
          bVar14 = true;
        }
        else {
LAB_00109a6a:
          bVar14 = false;
        }
      }
      std::__cxx11::string::substr((ulong)local_5c0,(ulong)&local_700);
      std::__cxx11::string::operator=((string *)&local_6b8,(string *)local_5c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c0._0_8_ != &local_5b0) {
        operator_delete((void *)local_5c0._0_8_,local_5b0._M_allocated_capacity + 1);
      }
      std::__cxx11::string::substr((ulong)local_5c0,(ulong)&local_700);
      std::__cxx11::string::operator=((string *)&local_720,(string *)local_5c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c0._0_8_ != &local_5b0) {
        operator_delete((void *)local_5c0._0_8_,local_5b0._M_allocated_capacity + 1);
      }
      std::__cxx11::string::substr((ulong)local_5c0,(ulong)&local_700);
      std::__cxx11::string::operator=((string *)&local_678,(string *)local_5c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c0._0_8_ != &local_5b0) {
        operator_delete((void *)local_5c0._0_8_,local_5b0._M_allocated_capacity + 1);
      }
      local_768.path._M_dataplus._M_p = (pointer)&local_768.path.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_768,local_6b8,local_6b8 + local_6b0);
      local_768.system = bVar14;
      fix_include(&local_638,&local_768,local_6e0,local_5d0,local_5c8,prefer_relative_to_root);
      pCVar3 = local_638.super__Vector_base<Candidate,_std::allocator<Candidate>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_638.super__Vector_base<Candidate,_std::allocator<Candidate>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_638.super__Vector_base<Candidate,_std::allocator<Candidate>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(local_3b0,local_700,local_6f8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        result->failed = result->failed + 1;
        if ((omit_system_failed & bVar14) == 0) {
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,RED_abi_cxx11_._M_dataplus._M_p,
                              RED_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,anon_var_dwarf_159c6,0x23);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_720,local_718);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,CLEAR_abi_cxx11_._M_dataplus._M_p,
                              CLEAR_abi_cxx11_._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
        }
      }
      else {
        std::filesystem::__cxx11::path::path
                  ((path *)local_5c0,
                   (path *)local_638.super__Vector_base<Candidate,_std::allocator<Candidate>_>.
                           _M_impl.super__Vector_impl_data._M_start);
        local_598 = (pCVar3->search_path).system;
        local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
        pcVar2 = (pCVar3->header)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_590,pcVar2,pcVar2 + (pCVar3->header)._M_string_length);
        local_570._0_4_ = pCVar3->filename_distance;
        local_570._4_4_ = pCVar3->folder_distance;
        local_740 = &local_730;
        local_738 = 0;
        local_730 = '\0';
        if (bVar14 == false) {
          if ((local_598 == '\0') || (user_to_system == false)) goto LAB_00109e54;
LAB_00109e02:
          std::operator+(&local_698,"<",&local_590);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_698);
          plVar10 = plVar11 + 2;
          if ((long *)*plVar11 == plVar10) {
            local_6c8 = *plVar10;
            lStack_6c0 = plVar11[3];
            local_6d8 = &local_6c8;
          }
          else {
            local_6c8 = *plVar10;
            local_6d8 = (long *)*plVar11;
          }
          local_6d0 = plVar11[1];
          *plVar11 = (long)plVar10;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_740,(string *)&local_6d8);
          if (local_6d8 != &local_6c8) {
            operator_delete(local_6d8,local_6c8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._M_dataplus._M_p != &local_698.field_2) {
            operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
          }
          psVar7 = local_5e0;
          if (bVar14 != false) goto LAB_00109fc5;
LAB_00109f33:
          *psVar7 = *psVar7 + 1;
          bVar14 = true;
        }
        else {
          if ((local_598 != '\0') || (user_to_system == false)) goto LAB_00109e02;
LAB_00109e54:
          std::operator+(&local_698,"\"",&local_590);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_698);
          plVar10 = plVar11 + 2;
          if ((long *)*plVar11 == plVar10) {
            local_6c8 = *plVar10;
            lStack_6c0 = plVar11[3];
            local_6d8 = &local_6c8;
          }
          else {
            local_6c8 = *plVar10;
            local_6d8 = (long *)*plVar11;
          }
          local_6d0 = plVar11[1];
          *plVar11 = (long)plVar10;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_740,(string *)&local_6d8);
          if (local_6d8 != &local_6c8) {
            operator_delete(local_6d8,local_6c8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._M_dataplus._M_p != &local_698.field_2) {
            operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
          }
          psVar7 = local_5d8;
          if (bVar14 != false) goto LAB_00109f33;
LAB_00109fc5:
          bVar14 = false;
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_3b0,"#include ",9);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(local_3b0,local_740,local_738);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_678,local_670);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        if ((local_590._M_string_length == local_6b0) &&
           ((local_590._M_string_length == 0 ||
            (iVar4 = bcmp(local_590._M_dataplus._M_p,local_6b8,local_590._M_string_length),
            iVar4 == 0)))) {
          if (bVar14) {
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,BLUE_abi_cxx11_._M_dataplus._M_p,
                                BLUE_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,anon_var_dwarf_15978,0x22);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_720,local_718);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ->  ",6);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_740,local_738);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,CLEAR_abi_cxx11_._M_dataplus._M_p,
                                CLEAR_abi_cxx11_._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          }
          else {
            result->untouched = result->untouched + 1;
            if (omit_untouched != false) {
              if (local_740 != &local_730) {
                operator_delete(local_740,CONCAT71(uStack_72f,local_730) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_590._M_dataplus._M_p != &local_590.field_2) {
                operator_delete(local_590._M_dataplus._M_p,
                                local_590.field_2._M_allocated_capacity + 1);
              }
              std::filesystem::__cxx11::path::~path((path *)local_5c0);
              goto LAB_0010a36c;
            }
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,GREEN_abi_cxx11_._M_dataplus._M_p,
                                GREEN_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,anon_var_dwarf_15992,0x1f);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_720,local_718);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,CLEAR_abi_cxx11_._M_dataplus._M_p,
                                CLEAR_abi_cxx11_._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          }
        }
        else {
          result->replaced_path = result->replaced_path + 1;
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,YELLOW_abi_cxx11_._M_dataplus._M_p,
                              YELLOW_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,anon_var_dwarf_15948,0x23);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_720,local_718);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ->  ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,local_740,local_738);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,DIM_abi_cxx11_._M_dataplus._M_p,
                              DIM_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  (distance: fn=",0x10);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(int)local_570);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"; dir=",6);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_570._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,") from ",7);
          pbVar8 = std::filesystem::__cxx11::operator<<(poVar5,(path *)local_5c0);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (pbVar8,CLEAR_abi_cxx11_._M_dataplus._M_p,
                              CLEAR_abi_cxx11_._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        }
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        if (1 < (ulong)(((long)local_638.super__Vector_base<Candidate,_std::allocator<Candidate>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_638.super__Vector_base<Candidate,_std::allocator<Candidate>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3))
        {
          uVar12 = 1;
          lVar13 = 0x58;
          do {
            pCVar3 = local_638.super__Vector_base<Candidate,_std::allocator<Candidate>_>._M_impl.
                     super__Vector_impl_data._M_start;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,DIM_abi_cxx11_._M_dataplus._M_p,
                                DIM_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"           - Alternative: ",0x1a);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,*(char **)((long)&(pCVar3->header)._M_dataplus._M_p + lVar13),
                       *(long *)((long)&(pCVar3->header)._M_string_length + lVar13));
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,DIM_abi_cxx11_._M_dataplus._M_p,
                                DIM_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  (distance: fn=",0x10);
            poVar5 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar5,
                                *(int *)((long)&pCVar3->filename_distance + lVar13));
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"; dir=",6);
            poVar5 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar5,*(int *)((long)&pCVar3->folder_distance + lVar13))
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,") from ",7);
            pbVar8 = std::filesystem::__cxx11::operator<<
                               (poVar5,(path *)((long)&(pCVar3->search_path).path._M_pathname.
                                                       _M_dataplus._M_p + lVar13));
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (pbVar8,CLEAR_abi_cxx11_._M_dataplus._M_p,
                                CLEAR_abi_cxx11_._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            uVar12 = uVar12 + 1;
            uVar9 = ((long)local_638.super__Vector_base<Candidate,_std::allocator<Candidate>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_638.super__Vector_base<Candidate,_std::allocator<Candidate>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
            lVar13 = lVar13 + 0x58;
          } while (uVar12 <= uVar9 && uVar9 - uVar12 != 0);
        }
        if (local_740 != &local_730) {
          operator_delete(local_740,CONCAT71(uStack_72f,local_730) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_590._M_dataplus._M_p != &local_590.field_2) {
          operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
        }
        std::filesystem::__cxx11::path::~path((path *)local_5c0);
      }
LAB_0010a36c:
      std::vector<Candidate,_std::allocator<Candidate>_>::~vector(&local_638);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_768.path._M_dataplus._M_p != &local_768.path.field_2) {
        operator_delete(local_768.path._M_dataplus._M_p,
                        local_768.path.field_2._M_allocated_capacity + 1);
      }
      if (local_720 != &local_710) {
        operator_delete(local_720,CONCAT71(uStack_70f,local_710) + 1);
      }
      if (local_678 != &local_668) {
        operator_delete(local_678,CONCAT71(uStack_667,local_668) + 1);
      }
      if (local_6b8 != &local_6a8) {
        operator_delete(local_6b8,CONCAT71(uStack_6a7,local_6a8) + 1);
      }
    }
    else {
LAB_00109909:
      plVar11 = local_658;
      if (local_650 != 0 && local_6f8 != 0) {
        lVar13 = 0;
        do {
          if (local_700[lVar13] != *(char *)((long)local_658 + lVar13)) goto LAB_00109a79;
          lVar1 = lVar13 + 1;
        } while ((local_6f8 + -1 != lVar13) &&
                (bVar14 = local_650 - 1 != lVar13, lVar13 = lVar1, bVar14));
        plVar11 = (long *)(lVar1 + (long)local_658);
      }
      if ((plVar11 == (long *)((long)local_658 + local_650)) && (process_system_includes == true))
      goto LAB_00109977;
LAB_00109a79:
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(local_3b0,local_700,local_6f8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    if (local_620 != local_610) {
      operator_delete(local_620,local_610[0] + 1);
    }
    if (local_658 != local_648) {
      operator_delete(local_658,local_648[0] + 1);
    }
    if (local_600[0] != local_5f0) {
      operator_delete(local_600[0],local_5f0[0] + 1);
    }
  } while( true );
}

Assistant:

void process_file(fs::path file, const std::vector<IncludePath> &include_paths,
                  const std::map<IncludePath, std::vector<fs::path>> &headers,
                  ProcessResult *result) {
  std::cout << "    Process " << file.string() << " ..." << std::endl;
  std::stringstream buffer;
  std::ifstream in(file.string());
  std::string line;
  while (std::getline(in, line, '\n')) {
    std::string prefix_all = "#include ";
    std::string prefix_system = "#include <";
    std::string prefix_user = "#include \"";
    if (boost::starts_with(line, prefix_user) ||
        (boost::starts_with(line, prefix_system) && process_system_includes)) {
      (result->total)++;

      std::string path, behind_path, path_with_quotes;
      size_t endPathPos = 0;
      bool system = false;
      if (boost::starts_with(line, prefix_user)) {
        endPathPos = line.find("\"", prefix_user.size());
        system = false;
      } else if (boost::starts_with(line, prefix_system)) {
        endPathPos = line.find(">", prefix_system.size());
        system = true;
      }

      path = line.substr(prefix_user.size(), endPathPos - prefix_user.size());
      path_with_quotes =
          line.substr(prefix_all.size(), endPathPos - prefix_all.size() + 1);
      behind_path = line.substr(endPathPos + 1);

      IncludeStmt current{path, system};
      std::vector<Candidate> candidate_fixes = fix_include(
          current, file, include_paths, headers, prefer_relative_to_root);

      if (!candidate_fixes.empty()) {
        Candidate fix = candidate_fixes[0];
        std::string fixed_path_with_quotes;
        bool emit_system_include = false;
        if ((system && fix.search_path.system) || // already good
            (!system && fix.search_path.system &&
             user_to_system) || // changed to system
            (system && !fix.search_path.system &&
             !user_to_system)) { // can't touch
          emit_system_include = true;
        }

        if (emit_system_include) {
          fixed_path_with_quotes = "<" + fix.header + ">";
        } else {
          fixed_path_with_quotes = "\"" + fix.header + "\"";
        }

        bool changed_include_type = system != emit_system_include;
        if (changed_include_type) {
          if (system) {
            result->system_to_user++;
          } else {
            result->user_to_system++;
          }
        }

        buffer << "#include " << fixed_path_with_quotes << behind_path
               << std::endl;
        if (fix.header != path) {
          (result->replaced_path)++;

          std::cout << YELLOW
                    << "        👕 Replace include path: " << path_with_quotes;
          std::cout << "  ->  " << fixed_path_with_quotes;
          std::cout << DIM << "  (distance: fn=" << fix.filename_distance
                    << "; dir=" << fix.folder_distance << ") from "
                    << fix.search_path.path << CLEAR << std::endl;
        } else if (changed_include_type) {
          std::cout << BLUE
                    << "        💄 Change include type: " << path_with_quotes;
          std::cout << "  ->  " << fixed_path_with_quotes << CLEAR << std::endl;
        } else {
          (result->untouched)++;

          if (omit_untouched) {
            continue; // the line is written.
          }
          std::cout << GREEN
                    << "        ✅ Untouched include: " << path_with_quotes
                    << CLEAR << std::endl;
        }

        for (int alt_idx = 1; alt_idx < candidate_fixes.size(); ++alt_idx) {
          Candidate &alt = candidate_fixes[alt_idx];
          std::cout << DIM << "           - Alternative: " << alt.header;
          std::cout << DIM << "  (distance: fn=" << alt.filename_distance
                    << "; dir=" << alt.folder_distance << ") from "
                    << alt.search_path.path << CLEAR << std::endl;
        }

      } else {
        buffer << line << std::endl;
        (result->failed)++;

        if (omit_system_failed && system) {
          continue; // the line is written.
        }
        std::cout << RED
                  << "        ❓ Failed to fix include: " << path_with_quotes
                  << CLEAR << std::endl;
      }
    } else {
      buffer << line << std::endl;
    }
  }
  in.close();

  if (!dry_run) {
    std::ofstream out(file.string());
    out << buffer.str();
    out.close();
  }
}